

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

int get_old_new(char *dir,FileName *varray,char *afile,char *vfile)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  FileName *pFVar9;
  FileName *pFVar10;
  char ver [16];
  char vbuf [16];
  int highest_p;
  char vless [4096];
  char name [4096];
  char to_file [4096];
  short local_3068 [8];
  char local_3058 [28];
  int local_303c;
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  strcpy(local_2038,afile);
  separate_version(local_2038,(char *)local_3068,1);
  pcVar6 = dir;
  pcVar7 = dir;
  pcVar3 = vfile;
  if (varray->version_no == 0xffffffff) {
    if (((char)local_3068[0] == '\0') || (local_3068[0] == 0x31)) {
      strcpy(afile,local_2038);
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '.';
      (afile + sVar4)[1] = '~';
      afile[sVar4 + 2] = '\0';
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '1';
      (afile + sVar4)[1] = '\0';
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '~';
      (afile + sVar4)[1] = '\0';
      pcVar3 = dir;
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
      if (pcVar6 + -1 == pcVar3) {
        if (pcVar3 == dir) {
          vfile[0] = '/';
          vfile[1] = '\0';
        }
        else {
          strcpy(vfile,dir);
        }
      }
      else {
        strcpy(vfile,dir);
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '/';
        (vfile + sVar4)[1] = '\0';
      }
      strcat(vfile,afile);
      pcVar3 = dir;
      for (pcVar6 = dir; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
      if (pcVar6 + -1 == pcVar3) {
        if (pcVar3 == dir) {
          afile[0] = '/';
          afile[1] = '\0';
        }
        else {
          strcpy(afile,dir);
        }
      }
      else {
        strcpy(afile,dir);
        sVar4 = strlen(afile);
        (afile + sVar4)[0] = '/';
        (afile + sVar4)[1] = '\0';
      }
      strcat(afile,local_2038);
      return 1;
    }
    for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar6, *pcVar7 != '\0'));
        pcVar7 = pcVar7 + 1) {
      pcVar6 = pcVar8;
    }
  }
  else {
    iVar1 = get_versionless(varray,local_3038,dir);
    if (iVar1 != 0) {
      if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
        if ((char)local_3068[0] == '\0') {
          pcVar3 = local_3038;
          strcpy(vfile,pcVar3);
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '.';
          (vfile + sVar4)[1] = '~';
          vfile[sVar4 + 2] = '\0';
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '1';
          (vfile + sVar4)[1] = '\0';
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '~';
          (vfile + sVar4)[1] = '\0';
          goto LAB_0011c4d9;
        }
        uVar2 = strtoul((char *)local_3068,(char **)0x0,10);
        if ((int)uVar2 != 1) {
          for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar6, *pcVar7 != '\0'));
              pcVar7 = pcVar7 + 1) {
            pcVar6 = pcVar8;
          }
          goto LAB_0011c48c;
        }
        strcpy(afile,local_2038);
        sVar4 = strlen(afile);
        (afile + sVar4)[0] = '.';
        (afile + sVar4)[1] = '~';
        afile[sVar4 + 2] = '\0';
        sVar4 = strlen(afile);
        (afile + sVar4)[0] = '1';
        (afile + sVar4)[1] = '\0';
        sVar4 = strlen(afile);
        (afile + sVar4)[0] = '~';
        (afile + sVar4)[1] = '\0';
        pcVar3 = dir;
        for (pcVar6 = dir; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
            pcVar6 = pcVar6 + 1) {
          pcVar3 = pcVar7;
        }
        if (pcVar6 + -1 == pcVar3) {
          if (pcVar3 == dir) {
            vfile[0] = '/';
            vfile[1] = '\0';
          }
          else {
            strcpy(vfile,dir);
          }
        }
        else {
          strcpy(vfile,dir);
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '/';
          (vfile + sVar4)[1] = '\0';
        }
        strcat(vfile,afile);
      }
      else {
        iVar1 = check_vless_link(local_3038,varray,local_1038,&local_303c);
        if (iVar1 == 0) {
          return 0;
        }
        if (local_1038[0] != '\0') {
          if ((char)local_3068[0] == '\0') {
            for (; (pcVar3 = pcVar7, *pcVar7 == '/' || (pcVar3 = pcVar6, *pcVar7 != '\0'));
                pcVar7 = pcVar7 + 1) {
              pcVar6 = pcVar3;
            }
            goto LAB_0011c112;
          }
          pFVar10 = (FileName *)0x0;
          uVar2 = strtoul((char *)local_3068,(char **)0x0,10);
          uVar5 = varray->version_no;
          pFVar9 = varray;
          if (uVar5 != 0xffffffff) {
            do {
              pFVar10 = pFVar9;
              if (uVar5 == (uint)uVar2) goto LAB_0011be09;
              uVar5 = pFVar10[1].version_no;
              pFVar9 = pFVar10 + 1;
            } while (uVar5 != 0xffffffff);
            pFVar10 = (FileName *)0x0;
          }
LAB_0011be09:
          if (pFVar10 == (FileName *)0x0) {
            strcpy(local_3038,varray->name);
            separate_version(local_3038,local_3058,1);
            pcVar6 = dir;
            for (pcVar7 = dir;
                (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar6, *pcVar7 != '\0'));
                pcVar7 = pcVar7 + 1) {
              pcVar6 = pcVar8;
            }
            if (pcVar7 + -1 == pcVar6) {
              if (pcVar6 == dir) {
                afile[0] = '/';
                afile[1] = '\0';
              }
              else {
                strcpy(afile,dir);
              }
            }
            else {
              strcpy(afile,dir);
              sVar4 = strlen(afile);
              (afile + sVar4)[0] = '/';
              (afile + sVar4)[1] = '\0';
            }
            strcat(afile,local_3038);
            strcpy(vfile,afile);
            if ((char)local_3068[0] != '\0') {
              sVar4 = strlen(vfile);
              (vfile + sVar4)[0] = '.';
              (vfile + sVar4)[1] = '~';
              vfile[sVar4 + 2] = '\0';
              strcat(vfile,(char *)local_3068);
              sVar4 = strlen(vfile);
              (vfile + sVar4)[0] = '~';
              (vfile + sVar4)[1] = '\0';
            }
            goto LAB_0011c4d9;
          }
          for (; (pcVar3 = pcVar7, *pcVar7 == '/' ||
                 (pcVar3 = pcVar6, varray = pFVar10, *pcVar7 != '\0')); pcVar7 = pcVar7 + 1) {
            pcVar6 = pcVar3;
          }
LAB_0011c2ff:
          if (pcVar7 + -1 == pcVar6) {
            if (pcVar6 == dir) {
              afile[0] = '/';
              afile[1] = '\0';
            }
            else {
              strcpy(afile,dir);
            }
          }
          else {
            strcpy(afile,dir);
            sVar4 = strlen(afile);
            (afile + sVar4)[0] = '/';
            (afile + sVar4)[1] = '\0';
          }
          goto LAB_0011c39a;
        }
        if ((char)local_3068[0] == '\0') {
          uVar2 = (ulong)(varray->version_no + 1);
        }
        else {
          uVar2 = strtoul((char *)local_3068,(char **)0x0,10);
          if (varray->version_no + 1 != (uint)uVar2) {
            uVar5 = varray->version_no;
            pFVar9 = varray;
            while (uVar5 != 0xffffffff) {
              if (uVar5 == (uint)uVar2) goto LAB_0011c2d6;
              pFVar10 = pFVar9 + 1;
              pFVar9 = pFVar9 + 1;
              uVar5 = pFVar10->version_no;
            }
            pFVar9 = (FileName *)0x0;
LAB_0011c2d6:
            if (pFVar9 == (FileName *)0x0) {
              pFVar9 = varray + -1;
              do {
                pFVar10 = pFVar9 + 1;
                pFVar9 = pFVar9 + 1;
              } while (pFVar10->version_no != 0xffffffff);
              strcpy(afile,pFVar9->name);
              if ((char)local_3068[0] != '\0') {
                sVar4 = strlen(afile);
                (afile + sVar4)[0] = '.';
                (afile + sVar4)[1] = '~';
                afile[sVar4 + 2] = '\0';
                strcat(afile,(char *)local_3068);
                sVar4 = strlen(afile);
                (afile + sVar4)[0] = '~';
                (afile + sVar4)[1] = '\0';
              }
              for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar6, *pcVar7 != '\0'));
                  pcVar7 = pcVar7 + 1) {
                pcVar6 = pcVar8;
              }
              goto LAB_0011c48c;
            }
            for (; (pcVar3 = pcVar7, *pcVar7 == '/' ||
                   (pcVar3 = pcVar6, varray = pFVar9, *pcVar7 != '\0')); pcVar7 = pcVar7 + 1) {
              pcVar6 = pcVar3;
            }
            goto LAB_0011c2ff;
          }
          uVar2 = uVar2 & 0xffffffff;
        }
        sprintf(local_3058,"%u",uVar2);
        strcpy(vfile,local_3038);
        if (local_3058[0] != '\0') {
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '.';
          (vfile + sVar4)[1] = '~';
          vfile[sVar4 + 2] = '\0';
          strcat(vfile,local_3058);
          sVar4 = strlen(vfile);
          (vfile + sVar4)[0] = '~';
          (vfile + sVar4)[1] = '\0';
        }
      }
      pcVar3 = local_3038;
      goto LAB_0011c4d9;
    }
    if ((char)local_3068[0] == '\0') {
      for (; (pcVar3 = pcVar7, *pcVar7 == '/' || (pcVar3 = pcVar6, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar6 = pcVar3;
      }
LAB_0011c112:
      if (pcVar7 + -1 == pcVar6) {
        if (pcVar6 == dir) {
          afile[0] = '/';
          afile[1] = '\0';
        }
        else {
          strcpy(afile,dir);
        }
      }
      else {
        strcpy(afile,dir);
        sVar4 = strlen(afile);
        (afile + sVar4)[0] = '/';
        (afile + sVar4)[1] = '\0';
      }
LAB_0011c39a:
      strcat(afile,varray->name);
      pcVar3 = afile;
      afile = vfile;
      goto LAB_0011c4d9;
    }
    pFVar10 = (FileName *)0x0;
    uVar2 = strtoul((char *)local_3068,(char **)0x0,10);
    uVar5 = varray->version_no;
    pFVar9 = varray;
    if (uVar5 != 0xffffffff) {
      do {
        pFVar10 = pFVar9;
        if (uVar5 == (uint)uVar2) goto LAB_0011beb5;
        uVar5 = pFVar10[1].version_no;
        pFVar9 = pFVar10 + 1;
      } while (uVar5 != 0xffffffff);
      pFVar10 = (FileName *)0x0;
    }
LAB_0011beb5:
    if (pFVar10 != (FileName *)0x0) {
      for (; (pcVar3 = pcVar7, *pcVar7 == '/' ||
             (pcVar3 = pcVar6, varray = pFVar10, *pcVar7 != '\0')); pcVar7 = pcVar7 + 1) {
        pcVar6 = pcVar3;
      }
      goto LAB_0011c2ff;
    }
    pFVar9 = varray + -1;
    do {
      pFVar10 = pFVar9 + 1;
      pFVar9 = pFVar9 + 1;
    } while (pFVar10->version_no != 0xffffffff);
    strcpy(afile,pFVar9->name);
    if ((char)local_3068[0] != '\0') {
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '.';
      (afile + sVar4)[1] = '~';
      afile[sVar4 + 2] = '\0';
      strcat(afile,(char *)local_3068);
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '~';
      (afile + sVar4)[1] = '\0';
    }
    for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar6, *pcVar7 != '\0'));
        pcVar7 = pcVar7 + 1) {
      pcVar6 = pcVar8;
    }
  }
LAB_0011c48c:
  if (pcVar7 + -1 == pcVar6) {
    if (pcVar6 == dir) {
      vfile[0] = '/';
      vfile[1] = '\0';
    }
    else {
      strcpy(vfile,dir);
    }
  }
  else {
    strcpy(vfile,dir);
    sVar4 = strlen(vfile);
    (vfile + sVar4)[0] = '/';
    (vfile + sVar4)[1] = '\0';
  }
  strcat(vfile,afile);
LAB_0011c4d9:
  strcpy(afile,pcVar3);
  return 1;
}

Assistant:

static int get_old_new(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (NoFileP(varray)) {
    /*
     * If there is no file with such name, "old/new" file is always
     * recognized.
     */
    if (*ver == '\0' || strcmp(ver, "1") == 0) {
      /*
       * If version is not specified or 1 is specified,
       * we can return versionless file as afile.
       */
      ConcNameAndVersion(name, "1", afile);
      ConcDirAndName(dir, afile, vfile);
      ConcDirAndName(dir, name, afile);
      return (1);
    } else {
      /*
       * A version other than 1 is specified.  "New" file
       * is recognized as if.
       */
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  }

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      }
      /*
       * There is not a file with the specified version in varray.
       * The specified file can be recognized as if.
       * Most user will hope to create a new file in same case as
       * old.   One of case sensitive names in the files are stored
       * in the trail marker entry in varray by get_version_array
       * routine.
       * We will use it, although we cannot say all of the gathered
       * files has the name in same case.
       */
      while (varray->version_no != LASTVERSIONARRAY) varray++;
      ConcNameAndVersion(varray->name, ver, afile);
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are recognized as if.
         */
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          }
          /*
           * There is not a file with the specified
           * version in varray.  The specified file can
           * be recognized as if.
           * Most user will hope to create a new file in
           * same case as old.   One of case sensitive
           * names in the files are stored in the trail
           * marker entry in varray by get_version_array
           * routine.
           * We will use it, although we cannot say all
           * of the gathered files has the name in same
           * case.
           */
          while (varray->version_no != LASTVERSIONARRAY) varray++;
          ConcNameAndVersion(varray->name, ver, afile);
          ConcDirAndName(dir, afile, vfile);
          strcpy(afile, vfile);
          return (1);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        }
        /*
         * There is not a file with the specified
         * version in varray.  The specified file can
         * be recognized as if.
         * Most user will hope to create a new file in
         * same case as old.   We will use the name of
         * the highest versioned file as the name of the
         * new file.
         */
        FindHighestVersion(varray, entry, max_no);
        strcpy(vless, entry->name);
        separate_version(vless, vbuf, 1);
        ConcDirAndName(dir, vless, afile);
        ConcNameAndVersion(afile, ver, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  }
}